

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_truncated_poisson_dist.hpp
# Opt level: O0

double __thiscall trng::zero_truncated_poisson_dist::pdf(zero_truncated_poisson_dist *this,int x)

{
  int in_ESI;
  param_type *in_RDI;
  double dVar1;
  double dVar2;
  undefined8 local_20;
  
  if (in_ESI < 1) {
    local_20 = 0.0;
  }
  else {
    dVar1 = math::ln_Gamma(1.85079510666925e-317);
    param_type::mu(in_RDI);
    dVar2 = math::ln(1.85082228027977e-317);
    local_20 = exp((double)in_ESI * dVar2 + -dVar1);
    dVar1 = param_type::mu(in_RDI);
    dVar1 = expm1(dVar1);
    local_20 = local_20 / dVar1;
  }
  return local_20;
}

Assistant:

double pdf(int x) const {
      return x <= 0 ? 0.0
                    : math::exp(-math::ln_Gamma(x + 1.0) + x * math::ln(P.mu())) /
                          math::expm1(P.mu());
    }